

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5CacheInstArray(Fts5Cursor *pCsr)

{
  Fts5PoslistReader *pFVar1;
  long lVar2;
  int iVar3;
  Fts5PoslistReader *pFVar4;
  u8 *puVar5;
  int *piVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  Fts5Cursor *pFVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  int n;
  u8 *a;
  int local_64;
  int local_60;
  uint local_5c;
  Fts5Cursor *local_58;
  int local_50;
  int local_4c;
  ulong local_48;
  u8 *local_40;
  u8 *local_38;
  
  local_64 = 0;
  if (pCsr->pExpr == (Fts5Expr *)0x0) {
    uVar9 = 0;
  }
  else {
    uVar9 = pCsr->pExpr->nPhrase;
  }
  local_50 = *(int *)&((pCsr->base).pVtab[1].pModule)->xBestIndex;
  if (pCsr->aInstIter == (Fts5PoslistReader *)0x0) {
    pFVar4 = (Fts5PoslistReader *)sqlite3Fts5MallocZero(&local_64,(long)(int)uVar9 << 5);
    pCsr->aInstIter = pFVar4;
  }
  pFVar4 = pCsr->aInstIter;
  if (pFVar4 != (Fts5PoslistReader *)0x0) {
    bVar16 = local_64 == 0;
    local_60 = local_64;
    local_5c = uVar9;
    local_58 = pCsr;
    if (0 < (int)uVar9 && bVar16) {
      piVar6 = &pFVar4->i;
      uVar14 = 0;
      do {
        local_60 = fts5CsrPoslist(local_58,(int)uVar14,&local_38,&local_4c);
        if (local_60 == 0) {
          ((Fts5PoslistReader *)(piVar6 + -3))->a = (u8 *)0x0;
          *(undefined8 *)(piVar6 + -1) = 0;
          *(undefined8 *)(piVar6 + 1) = 0;
          *(i64 *)(piVar6 + 3) = 0;
          ((Fts5PoslistReader *)(piVar6 + -3))->a = local_38;
          piVar6[-1] = local_4c;
          iVar3 = sqlite3Fts5PoslistNext64(local_38,local_4c,piVar6,(i64 *)(piVar6 + 3));
          if (iVar3 != 0) {
            *(u8 *)((long)piVar6 + 5) = '\x01';
          }
        }
        uVar14 = uVar14 + 1;
        bVar16 = local_60 == 0;
      } while ((uVar14 < uVar9) && (piVar6 = piVar6 + 8, local_60 == 0));
    }
    uVar14 = 0;
    pFVar13 = local_58;
    local_64 = local_60;
    if (bVar16) {
      uVar15 = (ulong)local_5c;
      local_40 = &pFVar4->bEof;
      uVar14 = 0;
      uVar9 = local_5c;
      do {
        uVar7 = 0xffffffff;
        if (0 < (int)uVar9) {
          uVar8 = 0;
          puVar5 = local_40;
          do {
            if ((*puVar5 == '\0') &&
               (((int)uVar7 < 0 || (*(long *)(puVar5 + 7) < pFVar4[uVar7].iPos)))) {
              uVar7 = (uint)uVar8;
            }
            uVar8 = uVar8 + 1;
            puVar5 = puVar5 + 0x20;
          } while (uVar15 != uVar8);
        }
        if ((int)uVar7 < 0) {
          bVar16 = false;
        }
        else {
          uVar12 = (int)uVar14 + 1;
          iVar3 = pFVar13->nInstAlloc;
          if ((int)uVar12 < iVar3) {
LAB_001bed6d:
            piVar6 = pFVar13->aInst;
            lVar11 = (long)((int)uVar14 * 3);
            piVar6[lVar11] = uVar7;
            lVar2 = pFVar4[uVar7].iPos;
            iVar3 = (int)((ulong)lVar2 >> 0x20);
            piVar6[lVar11 + 1] = iVar3;
            piVar6[lVar11 + 2] = (uint)lVar2 & 0x7fffffff;
            bVar16 = false;
            if ((lVar2 < 0) || (local_50 <= iVar3)) {
              local_60 = 0x10b;
            }
            else {
              pFVar1 = pFVar4 + uVar7;
              iVar3 = sqlite3Fts5PoslistNext64(pFVar1->a,pFVar1->n,&pFVar1->i,&pFVar4[uVar7].iPos);
              bVar16 = true;
              if (iVar3 != 0) {
                pFVar1->bEof = '\x01';
              }
            }
          }
          else {
            iVar10 = iVar3 * 2;
            if (iVar3 == 0) {
              iVar10 = 0x20;
            }
            pFVar13->nInstAlloc = iVar10;
            piVar6 = pFVar13->aInst;
            local_48 = uVar14;
            iVar3 = sqlite3_initialize();
            if (iVar3 == 0) {
              piVar6 = (int *)sqlite3Realloc(piVar6,(long)iVar10 * 0xc);
            }
            else {
              piVar6 = (int *)0x0;
            }
            pFVar13 = local_58;
            uVar9 = local_5c;
            if (piVar6 != (int *)0x0) {
              local_58->aInst = piVar6;
              uVar14 = local_48;
              goto LAB_001bed6d;
            }
            local_60 = 7;
            bVar16 = false;
          }
          uVar14 = (ulong)uVar12;
        }
      } while (bVar16);
      local_64 = local_60;
    }
    pFVar13->nInstCount = (int)uVar14;
    *(byte *)&pFVar13->csrflags = (byte)pFVar13->csrflags & 0xf7;
  }
  return local_64;
}

Assistant:

static int fts5CacheInstArray(Fts5Cursor *pCsr){
  int rc = SQLITE_OK;
  Fts5PoslistReader *aIter;       /* One iterator for each phrase */
  int nIter;                      /* Number of iterators/phrases */
  int nCol = ((Fts5Table*)pCsr->base.pVtab)->pConfig->nCol;
  
  nIter = sqlite3Fts5ExprPhraseCount(pCsr->pExpr);
  if( pCsr->aInstIter==0 ){
    sqlite3_int64 nByte = sizeof(Fts5PoslistReader) * nIter;
    pCsr->aInstIter = (Fts5PoslistReader*)sqlite3Fts5MallocZero(&rc, nByte);
  }
  aIter = pCsr->aInstIter;

  if( aIter ){
    int nInst = 0;                /* Number instances seen so far */
    int i;

    /* Initialize all iterators */
    for(i=0; i<nIter && rc==SQLITE_OK; i++){
      const u8 *a;
      int n; 
      rc = fts5CsrPoslist(pCsr, i, &a, &n);
      if( rc==SQLITE_OK ){
        sqlite3Fts5PoslistReaderInit(a, n, &aIter[i]);
      }
    }

    if( rc==SQLITE_OK ){
      while( 1 ){
        int *aInst;
        int iBest = -1;
        for(i=0; i<nIter; i++){
          if( (aIter[i].bEof==0) 
              && (iBest<0 || aIter[i].iPos<aIter[iBest].iPos) 
            ){
            iBest = i;
          }
        }
        if( iBest<0 ) break;

        nInst++;
        if( nInst>=pCsr->nInstAlloc ){
          pCsr->nInstAlloc = pCsr->nInstAlloc ? pCsr->nInstAlloc*2 : 32;
          aInst = (int*)sqlite3_realloc64(
              pCsr->aInst, pCsr->nInstAlloc*sizeof(int)*3
              );
          if( aInst ){
            pCsr->aInst = aInst;
          }else{
            rc = SQLITE_NOMEM;
            break;
          }
        }

        aInst = &pCsr->aInst[3 * (nInst-1)];
        aInst[0] = iBest;
        aInst[1] = FTS5_POS2COLUMN(aIter[iBest].iPos);
        aInst[2] = FTS5_POS2OFFSET(aIter[iBest].iPos);
        if( aInst[1]<0 || aInst[1]>=nCol ){
          rc = FTS5_CORRUPT;
          break;
        }
        sqlite3Fts5PoslistReaderNext(&aIter[iBest]);
      }
    }

    pCsr->nInstCount = nInst;
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_INST);
  }
  return rc;
}